

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcFlowSegmentType::~IfcFlowSegmentType(IfcFlowSegmentType *this)

{
  ~IfcFlowSegmentType((IfcFlowSegmentType *)
                      (&(this->super_IfcDistributionFlowElementType).
                        super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.
                        super_IfcTypeObject.field_0x0 +
                      *(long *)(*(long *)&(this->super_IfcDistributionFlowElementType).
                                          super_IfcDistributionElementType.super_IfcElementType.
                                          super_IfcTypeProduct.super_IfcTypeObject + -0x18)));
  return;
}

Assistant:

IfcFlowSegmentType() : Object("IfcFlowSegmentType") {}